

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O0

void to_file(vector<variant_t,_std::allocator<variant_t>_> *output_variants,string *out_path)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  size_type sVar4;
  string *in_RSI;
  vector<variant_t,_std::allocator<variant_t>_> *in_RDI;
  string DNA;
  string snv_type;
  string ID;
  pair<int,_int> d;
  variant_t v;
  iterator __end1;
  iterator __begin1;
  vector<variant_t,_std::allocator<variant_t>_> *__range1;
  int last_perc;
  int perc;
  uint64_t idx;
  uint64_t id_nr;
  ofstream out_file;
  vector<variant_t,_std::allocator<variant_t>_> *in_stack_fffffffffffffb18;
  variant_t *in_stack_fffffffffffffb20;
  variant_t *in_stack_fffffffffffffb38;
  variant_t *in_stack_fffffffffffffb40;
  ostream *in_stack_fffffffffffffb58;
  string *in_stack_fffffffffffffb68;
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [16];
  string *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  pair<int,_int> local_2c0;
  string local_2b8 [32];
  string local_298 [72];
  variant_t *local_250;
  __normal_iterator<variant_t_*,_std::vector<variant_t,_std::allocator<variant_t>_>_> local_248;
  vector<variant_t,_std::allocator<variant_t>_> *local_240;
  int local_228;
  int local_224;
  long local_220;
  long local_218;
  ostream local_210 [520];
  vector<variant_t,_std::allocator<variant_t>_> *local_8;
  
  local_8 = in_RDI;
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  local_218 = 1;
  local_220 = 0;
  local_224 = 0;
  local_228 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "(4/4) Computing edit distances and saving SNPs/indels to file ... ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_240 = local_8;
  local_248._M_current =
       (variant_t *)
       std::vector<variant_t,_std::allocator<variant_t>_>::begin(in_stack_fffffffffffffb18);
  local_250 = (variant_t *)
              std::vector<variant_t,_std::allocator<variant_t>_>::end(in_stack_fffffffffffffb18);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<variant_t_*,_std::vector<variant_t,_std::allocator<variant_t>_>_>
                             *)in_stack_fffffffffffffb20,
                            (__normal_iterator<variant_t_*,_std::vector<variant_t,_std::allocator<variant_t>_>_>
                             *)in_stack_fffffffffffffb18), bVar1) {
    __gnu_cxx::__normal_iterator<variant_t_*,_std::vector<variant_t,_std::allocator<variant_t>_>_>::
    operator*(&local_248);
    variant_t::variant_t(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    local_2c0 = distance(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    if (local_2c0.first <= max_snvs_def) {
      std::__cxx11::string::string(local_2e0);
      if (local_2c0.second == 0) {
        std::__cxx11::string::operator=(local_2e0,">SNP_higher_path_");
      }
      else {
        std::__cxx11::string::operator=(local_2e0,">INDEL_higher_path_");
      }
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb58);
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::append((char *)local_2e0);
      std::__cxx11::string::size();
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb58);
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::append((char *)local_2e0);
      std::__cxx11::string::string(local_340);
      if (local_2c0.second == 0) {
        std::__cxx11::string::size();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_2b8);
        std::__cxx11::string::operator+=(local_340,*pcVar3);
        std::__cxx11::string::append((char *)local_340);
        std::__cxx11::string::size();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_298);
        std::__cxx11::string::operator+=(local_340,*pcVar3);
      }
      else if (local_2c0.second < 1) {
        std::__cxx11::string::append((char *)local_340);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_380,(ulong)local_298);
        std::__cxx11::string::append(local_340);
        std::__cxx11::string::~string(local_380);
      }
      else {
        in_stack_fffffffffffffb68 = local_2b8;
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_360,(ulong)in_stack_fffffffffffffb68);
        std::__cxx11::string::append(local_340);
        std::__cxx11::string::~string(local_360);
        std::__cxx11::string::append((char *)local_340);
      }
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::append((char *)local_2e0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::append((char *)local_2e0);
      in_stack_fffffffffffffb58 = std::operator<<(local_210,local_2e0);
      std::ostream::operator<<(in_stack_fffffffffffffb58,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string(local_3c0);
      if (local_2c0.second == 0) {
        std::__cxx11::string::operator=(local_3c0,local_2b8);
      }
      else if (local_2c0.second < 1) {
        std::__cxx11::string::substr((ulong)local_3e0,(ulong)local_2b8);
        std::__cxx11::string::operator=(local_3c0,local_3e0);
        std::__cxx11::string::~string(local_3e0);
      }
      else {
        std::__cxx11::string::operator=(local_3c0,local_2b8);
      }
      std::__cxx11::string::append(local_3c0);
      poVar2 = std::operator<<(local_210,local_3c0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      if (local_2c0.second == 0) {
        std::__cxx11::string::operator=(local_2e0,">SNP_lower_path_");
      }
      else {
        std::__cxx11::string::operator=(local_2e0,">INDEL_lower_path_");
      }
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb58);
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::~string(local_400);
      std::__cxx11::string::append((char *)local_2e0);
      std::__cxx11::string::size();
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb58);
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::~string(local_420);
      std::__cxx11::string::append((char *)local_2e0);
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::append((char *)local_2e0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
      std::__cxx11::string::append(local_2e0);
      std::__cxx11::string::~string(local_440);
      std::__cxx11::string::append((char *)local_2e0);
      poVar2 = std::operator<<(local_210,local_2e0);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::operator=(local_3c0,"");
      if (local_2c0.second == 0) {
        std::__cxx11::string::operator=(local_3c0,local_298);
      }
      else if (local_2c0.second < 1) {
        std::__cxx11::string::operator=(local_3c0,local_298);
      }
      else {
        std::__cxx11::string::substr((ulong)local_460,(ulong)local_298);
        std::__cxx11::string::operator=(local_3c0,local_460);
        std::__cxx11::string::~string(local_460);
      }
      std::__cxx11::string::append(local_3c0);
      in_stack_fffffffffffffb40 = (variant_t *)std::operator<<(local_210,local_3c0);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffb40,std::endl<char,std::char_traits<char>>);
      local_218 = local_218 + 1;
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_2e0);
    }
    local_220 = local_220 + 1;
    in_stack_fffffffffffffb38 = (variant_t *)(local_220 * 100);
    sVar4 = std::vector<variant_t,_std::allocator<variant_t>_>::size(local_8);
    local_224 = (int)((ulong)in_stack_fffffffffffffb38 / sVar4);
    if (local_228 + 10 <= local_224) {
      local_228 = local_224;
      poVar2 = std::operator<<((ostream *)&std::cout," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_224);
      in_stack_fffffffffffffb20 = (variant_t *)std::operator<<(poVar2,"% done.");
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffb20,std::endl<char,std::char_traits<char>>);
    }
    variant_t::~variant_t(in_stack_fffffffffffffb20);
    __gnu_cxx::__normal_iterator<variant_t_*,_std::vector<variant_t,_std::allocator<variant_t>_>_>::
    operator++(&local_248);
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void to_file(vector<variant_t> & output_variants, string & out_path){

	ofstream out_file = ofstream(out_path);

	uint64_t id_nr = 1;
	uint64_t idx = 0;

	int perc = 0;
	int last_perc = 0;

	cout << "(4/4) Computing edit distances and saving SNPs/indels to file ... " << endl;
	for(auto v:output_variants){

		auto d = distance(v.left_context_0,v.left_context_1);

		if(d.first <= max_snvs_def){

			/*
			 * sample 1
			 */

			string ID;

			if(d.second != 0){

				ID =  ">INDEL_higher_path_";

			}else{

				ID =  ">SNP_higher_path_";

			}

			ID.append(to_string(id_nr));
			ID.append("|P_1:");
			ID.append(to_string(v.right_context.size()));
			ID.append("_");

			string snv_type;

			if(d.second==0){

				snv_type += v.left_context_0[v.left_context_0.size()-1];
				snv_type.append("/");
				snv_type += v.left_context_1[v.left_context_1.size()-1];

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				snv_type.append(v.left_context_0.substr(v.left_context_0.size()-d.second));
				snv_type.append("/");

			}else{//insert of length -d.second in v.left_context_1

				snv_type.append("/");
				snv_type.append(v.left_context_1.substr(v.left_context_1.size() - (-d.second)));

			}

			ID.append(snv_type);
			ID.append("|");
			ID.append(std::to_string(v.support_0));//we write the number of reads supporting this variant
			//ID.append("high");
			ID.append("|nb_pol_1");

			out_file << ID << endl;

			string DNA;

			if(d.second==0){

				DNA = v.left_context_0;

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				DNA = v.left_context_0;

			}else{//insert of length -d.second in v.left_context_1

				DNA = v.left_context_0.substr(-d.second);

			}

			DNA.append(v.right_context);

			out_file << DNA << endl;

			/*
			 * sample 2
			 */

			if(d.second != 0){

				ID =  ">INDEL_lower_path_";

			}else{

				ID =  ">SNP_lower_path_";

			}

			ID.append(to_string(id_nr));
			ID.append("|P_1:");
			ID.append(to_string(v.right_context.size()));
			ID.append("_");
			ID.append(snv_type);
			ID.append("|");
			ID.append(std::to_string(v.support_1));
			//ID.append("high");
			ID.append("|nb_pol_1");

			out_file << ID << endl;

			DNA = "";

			if(d.second==0){

				DNA = v.left_context_1;

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				DNA = v.left_context_1.substr(d.second);

			}else{//insert of length -d.second in v.left_context_1

				DNA = v.left_context_1;

			}

			DNA.append(v.right_context);
			out_file << DNA << endl;

			id_nr++;

		}

		idx++;

		perc = (idx*100)/output_variants.size();
		if(perc >= last_perc+10){

			last_perc=perc;
			cout << " " << perc << "% done." << endl;

		}

	}

}